

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CTypeCheckerVisitor.cpp
# Opt level: O1

void __thiscall CTypeCheckerVisitor::Visit(CTypeCheckerVisitor *this,CMainClass *stm)

{
  CIdExp *pCVar1;
  CMainMethod *pCVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  mapped_type *pmVar3;
  char *pcVar4;
  undefined1 local_50 [8];
  _Alloc_hider local_48;
  char local_40 [8];
  char local_38 [24];
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"typechecker: mainclass\n",0x17);
  pCVar1 = (stm->id)._M_t.super___uniq_ptr_impl<CIdExp,_std::default_delete<CIdExp>_>._M_t.
           super__Tuple_impl<0UL,_CIdExp_*,_std::default_delete<CIdExp>_>.
           super__Head_base<0UL,_CIdExp_*,_false>._M_head_impl;
  if (pCVar1 == (CIdExp *)0x0) {
    CError::CError((CError *)local_50,&CError::AST_ERROR_abi_cxx11_,
                   &(stm->super_IWrapper).super_PositionedNode.position);
    std::vector<CError,_std::allocator<CError>_>::emplace_back<CError>
              (&this->errors,(CError *)local_50);
    pcVar4 = local_40;
    local_48._M_p = (pointer)local_50;
  }
  else {
    pmVar3 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ClassInfo>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ClassInfo>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ClassInfo>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<ClassInfo>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)(this->table).
                             super___shared_ptr<SymbolTable,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                          &pCVar1->name);
    (this->currentClass).super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (pmVar3->super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->currentClass).super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,
               &(pmVar3->super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>)._M_refcount);
    pCVar1 = (stm->id)._M_t.super___uniq_ptr_impl<CIdExp,_std::default_delete<CIdExp>_>._M_t.
             super__Tuple_impl<0UL,_CIdExp_*,_std::default_delete<CIdExp>_>.
             super__Head_base<0UL,_CIdExp_*,_false>._M_head_impl;
    (*(code *)**(undefined8 **)&(pCVar1->super_IExpression).super_PositionedNode)(pCVar1,this);
    pCVar2 = (stm->mainMethod)._M_t.
             super___uniq_ptr_impl<CMainMethod,_std::default_delete<CMainMethod>_>._M_t.
             super__Tuple_impl<0UL,_CMainMethod_*,_std::default_delete<CMainMethod>_>.
             super__Head_base<0UL,_CMainMethod_*,_false>._M_head_impl;
    (*(code *)**(undefined8 **)&(pCVar2->super_IWrapper).super_PositionedNode)(pCVar2,this);
    TypeInfo::TypeInfo((TypeInfo *)local_50,VOID);
    (this->lastCalculatedType).isPrimitive = (bool)local_50[0];
    *(undefined3 *)&(this->lastCalculatedType).field_0x1 = local_50._1_3_;
    (this->lastCalculatedType).type = local_50._4_4_;
    std::__cxx11::string::operator=
              ((string *)&(this->lastCalculatedType).className,(string *)&local_48);
    pcVar4 = local_38;
  }
  if (local_48._M_p != pcVar4) {
    operator_delete(local_48._M_p);
  }
  this_00 = (this->currentClass).super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (this->currentClass).super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->currentClass).super___shared_ptr<ClassInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return;
}

Assistant:

void CTypeCheckerVisitor::Visit( CMainClass &stm )
{
	std::cout << "typechecker: mainclass\n";
    if( stm.id ) {
        currentClass = table->classes[stm.id->name];
        stm.id->Accept( *this );
        stm.mainMethod->Accept( *this );
        lastCalculatedType = enums::TPrimitiveType::VOID;
    } else {
        errors.push_back( CError( CError::AST_ERROR, stm.position ) );
    }
    currentClass = nullptr;
}